

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O0

void __thiscall
Outputs::Speaker::LowpassBase<Outputs::Speaker::PushLowpass<true>,_true>::set_high_frequency_cutoff
          (LowpassBase<Outputs::Speaker::PushLowpass<true>,_true> *this,float high_frequency)

{
  float fVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock_guard;
  float high_frequency_local;
  LowpassBase<Outputs::Speaker::PushLowpass<true>,_true> *this_local;
  
  lock_guard._M_device._4_4_ = high_frequency;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->filter_parameters_mutex_);
  fVar1 = (this->filter_parameters_).high_frequency_cutoff;
  if ((fVar1 != lock_guard._M_device._4_4_) || (NAN(fVar1) || NAN(lock_guard._M_device._4_4_))) {
    (this->filter_parameters_).high_frequency_cutoff = lock_guard._M_device._4_4_;
    (this->filter_parameters_).parameters_are_dirty = true;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void set_high_frequency_cutoff(float high_frequency) {
			std::lock_guard lock_guard(filter_parameters_mutex_);
			if(filter_parameters_.high_frequency_cutoff == high_frequency) {
				return;
			}
			filter_parameters_.high_frequency_cutoff = high_frequency;
			filter_parameters_.parameters_are_dirty = true;
		}